

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

void __thiscall
ot::commissioner::TokenManager::TokenManager(TokenManager *this,event_base *aEventBase)

{
  (this->mSignedToken).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSignedToken).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mSequenceNumber = 0;
  (this->mSignedToken).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mCommissionerId)._M_dataplus._M_p = (pointer)&(this->mCommissionerId).field_2;
  (this->mCommissionerId)._M_string_length = 0;
  (this->mCommissionerId).field_2._M_local_buf[0] = '\0';
  (this->mDomainName)._M_dataplus._M_p = (pointer)&(this->mDomainName).field_2;
  (this->mDomainName)._M_string_length = 0;
  (this->mDomainName).field_2._M_local_buf[0] = '\0';
  coap::CoapSecure::CoapSecure(&this->mRegistrarClient,aEventBase,false);
  mbedtls_entropy_init((mbedtls_entropy_context *)&this->mEntropy);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)&this->mCtrDrbg);
  mbedtls_ctr_drbg_seed
            ((mbedtls_ctr_drbg_context *)&this->mCtrDrbg,mbedtls_entropy_func,&this->mEntropy,
             (uchar *)0x0,0);
  mbedtls_pk_init((mbedtls_pk_context *)&this->mPublicKey);
  mbedtls_pk_init((mbedtls_pk_context *)&this->mPrivateKey);
  mbedtls_pk_init((mbedtls_pk_context *)&this->mDomainCAPublicKey);
  return;
}

Assistant:

TokenManager::TokenManager(struct event_base *aEventBase)
    : mRegistrarClient(aEventBase)
{
    mbedtls_entropy_init(&mEntropy);
    mbedtls_ctr_drbg_init(&mCtrDrbg);
    mbedtls_ctr_drbg_seed(&mCtrDrbg, mbedtls_entropy_func, &mEntropy, nullptr, 0);
    mbedtls_pk_init(&mPublicKey);
    mbedtls_pk_init(&mPrivateKey);
    mbedtls_pk_init(&mDomainCAPublicKey);
}